

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  UnitTestImpl *this_00;
  long *in_RDI;
  string *in_stack_000000c8;
  string *in_stack_000000d0;
  int in_stack_000000dc;
  char *in_stack_000000e0;
  Type in_stack_000000ec;
  UnitTest *in_stack_000000f0;
  int skip_count;
  string local_50 [16];
  Message *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  UnitTest::GetInstance();
  skip_count = *(int *)(*in_RDI + 0x10);
  AppendUserMessage(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  this_00 = (UnitTestImpl *)UnitTest::GetInstance();
  UnitTest::impl((UnitTest *)this_00);
  UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_(this_00,skip_count);
  UnitTest::AddTestPartResult
            (in_stack_000000f0,in_stack_000000ec,in_stack_000000e0,in_stack_000000dc,
             in_stack_000000d0,in_stack_000000c8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->
    AddTestPartResult(data_->type, data_->file, data_->line,
                      AppendUserMessage(data_->message, message),
                      UnitTest::GetInstance()->impl()
                      ->CurrentOsStackTraceExceptTop(1)
                      // Skips the stack frame for this function itself.
                      );  // NOLINT
}